

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDFace *quad_face,double quad_s,double quad_t)

{
  bool bVar1;
  ON_2dPoint OVar2;
  ON_SubDFaceParameter fp;
  ON_SubDComponentId local_30;
  ON_SubDFaceParameter local_28;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  if ((quad_face != (ON_SubDFace *)0x0) && (quad_face->m_edge_count == 4)) {
    ON_SubDComponentId::ON_SubDComponentId(&local_30,quad_face);
    bVar1 = Internal_Init(this,local_30);
    if (bVar1) {
      ON_SubDFaceParameter::CreateFromQuadFaceParameteters(&local_28,quad_s,quad_t);
      OVar2 = ON_SubDFaceParameter::FaceCornerParameters(&local_28);
      this->m_p0 = (anon_union_8_3_6bf0bb0e_for_m_p0)OVar2.x;
      this->m_p1 = (anon_union_8_3_7b68a318_for_m_p1)OVar2.y;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const class ON_SubDFace* quad_face,
  double quad_s,
  double quad_t
)
{
  if (
    nullptr != quad_face
    && 4 == quad_face->m_edge_count
    && Internal_Init(quad_face)
    )
  {
    const ON_SubDFaceParameter fp = ON_SubDFaceParameter::CreateFromQuadFaceParameteters(quad_s, quad_t);
    const ON_2dPoint p = fp.FaceCornerParameters();
    this->m_p0.f_corner_s = p.x;
    this->m_p1.f_corner_t = p.y;
  }
}